

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myHashMap.h
# Opt level: O2

wallet * __thiscall myHashMap<wallet>::getData(myHashMap<wallet> *this,myString *key)

{
  myBucket_chain<wallet> *pmVar1;
  uint uVar2;
  wallet *pwVar3;
  myString local_30;
  
  uVar2 = (*this->hashFunc)(key,this->tableSize);
  pmVar1 = this->table;
  myString::myString(&local_30,key);
  pwVar3 = myBucket_chain<wallet>::getData(pmVar1 + (int)uVar2,&local_30);
  myString::~myString(&local_30);
  return pwVar3;
}

Assistant:

T* getData(myString key) {
        int indexHash = hashFunc(key,this->tableSize);

        return this->table[indexHash].getData(key);

    }